

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderProgram.cpp
# Opt level: O2

TestLog * glu::operator<<(TestLog *log,ShaderProgramInfo *shaderProgramInfo)

{
  long lVar1;
  size_t ndx;
  ulong uVar2;
  ShaderInfo **shaderInfos;
  ulong numShaders;
  allocator_type local_29;
  vector<const_glu::ShaderInfo_*,_std::allocator<const_glu::ShaderInfo_*>_> shaderPtrs;
  
  std::vector<const_glu::ShaderInfo_*,_std::allocator<const_glu::ShaderInfo_*>_>::vector
            (&shaderPtrs,
             ((long)(shaderProgramInfo->shaders).
                    super__Vector_base<glu::ShaderInfo,_std::allocator<glu::ShaderInfo>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(shaderProgramInfo->shaders).
                   super__Vector_base<glu::ShaderInfo,_std::allocator<glu::ShaderInfo>_>._M_impl.
                   super__Vector_impl_data._M_start) / 0x58,&local_29);
  lVar1 = 0;
  uVar2 = 0;
  while( true ) {
    numShaders = (long)shaderPtrs.
                       super__Vector_base<const_glu::ShaderInfo_*,_std::allocator<const_glu::ShaderInfo_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)shaderPtrs.
                       super__Vector_base<const_glu::ShaderInfo_*,_std::allocator<const_glu::ShaderInfo_*>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3;
    if (numShaders <= uVar2) break;
    shaderPtrs.super__Vector_base<const_glu::ShaderInfo_*,_std::allocator<const_glu::ShaderInfo_*>_>
    ._M_impl.super__Vector_impl_data._M_start[uVar2] =
         (ShaderInfo *)
         ((long)&((shaderProgramInfo->shaders).
                  super__Vector_base<glu::ShaderInfo,_std::allocator<glu::ShaderInfo>_>._M_impl.
                  super__Vector_impl_data._M_start)->type + lVar1);
    uVar2 = uVar2 + 1;
    lVar1 = lVar1 + 0x58;
  }
  shaderInfos = (ShaderInfo **)0x0;
  if (shaderPtrs.
      super__Vector_base<const_glu::ShaderInfo_*,_std::allocator<const_glu::ShaderInfo_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      shaderPtrs.
      super__Vector_base<const_glu::ShaderInfo_*,_std::allocator<const_glu::ShaderInfo_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    shaderInfos = shaderPtrs.
                  super__Vector_base<const_glu::ShaderInfo_*,_std::allocator<const_glu::ShaderInfo_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  }
  logShaderProgram(log,&shaderProgramInfo->program,numShaders,shaderInfos);
  std::_Vector_base<const_glu::ShaderInfo_*,_std::allocator<const_glu::ShaderInfo_*>_>::
  ~_Vector_base(&shaderPtrs.
                 super__Vector_base<const_glu::ShaderInfo_*,_std::allocator<const_glu::ShaderInfo_*>_>
               );
  return log;
}

Assistant:

tcu::TestLog& operator<< (tcu::TestLog& log, const ShaderProgramInfo& shaderProgramInfo)
{
	std::vector<const ShaderInfo*>	shaderPtrs	(shaderProgramInfo.shaders.size());

	for (size_t ndx = 0; ndx < shaderPtrs.size(); ndx++)
		shaderPtrs[ndx] = &shaderProgramInfo.shaders[ndx];

	logShaderProgram(log, shaderProgramInfo.program, shaderPtrs.size(), shaderPtrs.empty() ? DE_NULL : &shaderPtrs[0]);

	return log;
}